

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O0

void __thiscall
CommandDrawImage::Draw(CommandDrawImage *this,SBarInfoMainBlock *block,DSBarInfo *statusBar)

{
  double dVar1;
  SBarInfoCoordinate x;
  SBarInfoCoordinate y;
  FTexture *texture;
  bool fullScreenOffsets;
  int xOffset;
  int yOffset;
  double dVar2;
  double dVar3;
  double dVar4;
  double texheight;
  double texwidth;
  double scale2;
  double scale1;
  double frameAlpha;
  int h;
  int w;
  DSBarInfo *statusBar_local;
  SBarInfoMainBlock *block_local;
  CommandDrawImage *this_local;
  
  if ((this->flags & 0x80) != 0) {
    SBarInfoCommandFlowControl::Draw(&this->super_SBarInfoCommandFlowControl,block,statusBar);
  }
  if (this->texture != (FTexture *)0x0) {
    frameAlpha._4_4_ = this->maxwidth;
    frameAlpha._0_4_ = this->maxheight;
    dVar2 = SBarInfoMainBlock::Alpha(block);
    dVar1 = this->alpha;
    if ((this->flags & 0x20) == 0) {
      if ((this->applyscale & 1U) != 0) {
        dVar3 = FTexture::GetScaledWidthDouble(this->texture);
        frameAlpha._4_4_ = (int)(dVar3 * this->spawnScaleX);
        dVar3 = FTexture::GetScaledHeightDouble(this->texture);
        frameAlpha._0_4_ = (int)(dVar3 * this->spawnScaleY);
      }
    }
    else {
      texwidth = 1.0;
      scale2 = 1.0;
      dVar3 = FTexture::GetScaledWidthDouble(this->texture);
      dVar3 = (double)(int)(dVar3 * this->spawnScaleX);
      dVar4 = FTexture::GetScaledHeightDouble(this->texture);
      dVar4 = (double)(int)(dVar4 * this->spawnScaleY);
      if ((frameAlpha._4_4_ != -1) &&
         (((double)frameAlpha._4_4_ < dVar3 || ((this->flags & 0x40) != 0)))) {
        scale2 = (double)frameAlpha._4_4_ / dVar3;
      }
      if ((frameAlpha._0_4_ != -1) &&
         (((double)frameAlpha._0_4_ < dVar4 || ((this->flags & 0x40) != 0)))) {
        texwidth = (double)frameAlpha._0_4_ / dVar4;
      }
      if ((this->flags & 0x40) == 0) {
        if (texwidth < scale2) {
          scale2 = texwidth;
        }
      }
      else if ((frameAlpha._4_4_ == -1) || ((frameAlpha._0_4_ != -1 && (texwidth < scale2)))) {
        scale2 = texwidth;
      }
      frameAlpha._4_4_ = (int)(dVar3 * scale2);
      frameAlpha._0_4_ = (int)(dVar4 * scale2);
    }
    texture = this->texture;
    x = this->imgx;
    y = this->imgy;
    xOffset = SBarInfoMainBlock::XOffset(block);
    yOffset = SBarInfoMainBlock::YOffset(block);
    fullScreenOffsets = SBarInfoMainBlock::FullScreenOffsets(block);
    DSBarInfo::DrawGraphic
              (statusBar,texture,x,y,xOffset,yOffset,dVar2 * dVar1,fullScreenOffsets,
               (bool)((this->super_SBarInfoCommandFlowControl).field_0x31 & 1),false,this->offset,
               false,frameAlpha._4_4_,frameAlpha._0_4_,nulclip,false);
  }
  return;
}

Assistant:

void	Draw(const SBarInfoMainBlock *block, const DSBarInfo *statusBar)
		{
			if(flags & DI_ALTERNATEONFAIL)
				SBarInfoCommandFlowControl::Draw(block, statusBar);

			if(texture == NULL)
				return;

			int w = maxwidth, h = maxheight;
			
			// We must calculate this per frame in order to prevent glitches with cl_capfps true.
			double frameAlpha = block->Alpha() * alpha;
			
			if(flags & DI_DRAWINBOX)
			{
				double scale1, scale2;
				scale1 = scale2 = 1.0f;
				double texwidth = (int) (texture->GetScaledWidthDouble()*spawnScaleX);
				double texheight = (int) (texture->GetScaledHeightDouble()*spawnScaleY);
				
				if (w != -1 && (w<texwidth || (flags & DI_FORCESCALE)))
				{
					scale1 = w/texwidth;
				}
				if (h != -1 && (h<texheight || (flags & DI_FORCESCALE)))
				{
					scale2 = h/texheight;
				}
				
				if (flags & DI_FORCESCALE)
				{
					if (w == -1 || (h != -1 && scale2<scale1))
						scale1=scale2;
				}
				else if (scale2<scale1) scale1=scale2;
				
				w=(int)(texwidth*scale1);
				h=(int)(texheight*scale1);
			}
			else if (applyscale)
			{
				w=(int) (texture->GetScaledWidthDouble()*spawnScaleX);
				h=(int) (texture->GetScaledHeightDouble()*spawnScaleY);
			}
			statusBar->DrawGraphic(texture, imgx, imgy, block->XOffset(), block->YOffset(), frameAlpha, block->FullScreenOffsets(),
				translatable, false, offset, false, w, h);
		}